

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O1

UnitQuaternion * composeQuaternion(UnitQuaternion *q1,UnitQuaternion *q2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  UnitQuaternion *in_RDI;
  
  dVar1 = q1->m_data[0];
  dVar2 = q1->m_data[1];
  dVar3 = q2->m_data[0];
  dVar4 = q2->m_data[1];
  dVar5 = q1->m_data[2];
  dVar6 = q1->m_data[3];
  dVar7 = q2->m_data[2];
  dVar8 = q2->m_data[3];
  in_RDI->m_data[0] = dVar1 * dVar3 - (dVar8 * dVar6 + dVar7 * dVar5 + dVar4 * dVar2);
  in_RDI->m_data[1] = dVar3 * dVar2 + dVar1 * dVar4 + (dVar8 * dVar5 - dVar6 * dVar7);
  in_RDI->m_data[2] = dVar3 * dVar5 + dVar1 * dVar7 + (dVar4 * dVar6 - dVar2 * dVar8);
  in_RDI->m_data[3] = dVar6 * dVar3 + dVar1 * dVar8 + (dVar2 * dVar7 - dVar4 * dVar5);
  return in_RDI;
}

Assistant:

iDynTree::UnitQuaternion composeQuaternion(const iDynTree::UnitQuaternion &q1, const iDynTree::UnitQuaternion &q2)
{
    using iDynTree::toEigen;

    double s1 = realPartOfQuaternion(q1);
    iDynTree::Vector3 v1 = imaginaryPartOfQuaternion(q1);

    double s2 = realPartOfQuaternion(q2);
    iDynTree::Vector3 v2 = imaginaryPartOfQuaternion(q2);

    iDynTree::Vector3 imagOut;
    toEigen(imagOut) = toEigen(v2)*s1 + toEigen(v1)*s2 + toEigen(crossVector(v1, v2)); // to be read as imagOut = v2*s1 + v1*s2 + crossVector(v1, v2)

    iDynTree::UnitQuaternion out;
    out(0) = s1*s2 - innerProduct(v1, v2);
    out(1) = imagOut(0);
    out(2) = imagOut(1);
    out(3) = imagOut(2);

    return out;
}